

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::alloc_node
          (xpath_parser *this,ast_type_t type,xpath_ast_node *left,xpath_ast_node *right,
          predicate_t test)

{
  xpath_ast_node *pxVar1;
  
  pxVar1 = (xpath_ast_node *)alloc_node(this);
  if (pxVar1 != (xpath_ast_node *)0x0) {
    pxVar1->_type = (char)type;
    pxVar1->_rettype = '\x01';
    pxVar1->_axis = '\0';
    pxVar1->_test = '\0';
    pxVar1->_left = left;
    pxVar1->_right = right;
    pxVar1->_next = (xpath_ast_node *)0x0;
    if ((type & ~ast_op_or) != ast_predicate) {
      __assert_fail("type == ast_filter || type == ast_predicate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2826,
                    "pugi::impl::(anonymous namespace)::xpath_ast_node::xpath_ast_node(ast_type_t, xpath_ast_node *, xpath_ast_node *, predicate_t)"
                   );
    }
  }
  return pxVar1;
}

Assistant:

xpath_ast_node* alloc_node(ast_type_t type, xpath_ast_node* left, xpath_ast_node* right, predicate_t test)
		{
			void* memory = alloc_node();
			return memory ? new (memory) xpath_ast_node(type, left, right, test) : 0;
		}